

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_simple.cpp
# Opt level: O3

int main(void)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hello;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> world;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> world_1
  ;
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  cache;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_190;
  bool local_170;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  bool local_148;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_140;
  bool local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  unsigned_long local_b8;
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  local_b0;
  
  cappuccino::
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::lru_cache(&local_b0,2,1.0);
  local_190._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Hello","");
  cappuccino::
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_b0,(unsigned_long *)&local_190,&local_d8,insert_or_update);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_190._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"World","");
  cappuccino::
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::insert(&local_b0,(unsigned_long *)&local_190,&local_f8,insert_or_update);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_168._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
  cappuccino::
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_190,&local_b0,(unsigned_long *)&local_168,no);
  local_140._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2;
  cappuccino::
  lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_168,&local_b0,(unsigned_long *)&local_140,no);
  if (local_170 == true) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_190._M_value._M_dataplus._M_p,
                        local_190._M_value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    if (local_148 != false) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_168._M_value._M_dataplus._M_p,
                          local_168._M_value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((local_148 == true) &&
         (local_148 = false,
         local_168._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_168._M_value + 0x10))) {
        operator_delete((void *)local_168._M_value._M_dataplus._M_p,local_168._16_8_ + 1);
      }
      if ((local_170 == true) &&
         (local_170 = false,
         local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10))) {
        operator_delete((void *)local_190._M_value._M_dataplus._M_p,local_190._16_8_ + 1);
      }
      local_190._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x3;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Hola","");
      cappuccino::
      lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::insert(&local_b0,(unsigned_long *)&local_190,&local_118,insert_or_update);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      local_168._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x3;
      cappuccino::
      lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190,&local_b0,(unsigned_long *)&local_168,no);
      local_140._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x1;
      cappuccino::
      lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_168,&local_b0,(unsigned_long *)&local_140,no);
      local_b8 = 2;
      cappuccino::
      lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_140,&local_b0,&local_b8,no);
      if (local_170 == true) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_190._M_value._M_dataplus._M_p,
                            local_190._M_value._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        if (local_120 != false) {
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,(char *)local_140._M_value._M_dataplus._M_p,
                              local_140._M_value._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          if (local_148 == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"impossibru!",0xb);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
            std::ostream::put(-0x40);
            std::ostream::flush();
          }
          if ((local_120 == true) &&
             (local_120 = false,
             local_140._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_140._M_value + 0x10)
             )) {
            operator_delete((void *)local_140._M_value._M_dataplus._M_p,local_140._16_8_ + 1);
          }
          if ((local_148 == true) &&
             (local_148 = false,
             local_168._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_168._M_value + 0x10)
             )) {
            operator_delete((void *)local_168._M_value._M_dataplus._M_p,local_168._16_8_ + 1);
          }
          if ((local_170 == true) &&
             (local_170 = false,
             local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10)
             )) {
            operator_delete((void *)local_190._M_value._M_dataplus._M_p,local_190._16_8_ + 1);
          }
          while (local_b0.m_lru_list.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl._M_node.super__List_node_base._M_next !=
                 (_List_node_base *)&local_b0.m_lru_list) {
            p_Var1 = (local_b0.m_lru_list.
                      super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      _M_node.super__List_node_base._M_next)->_M_next;
            operator_delete(local_b0.m_lru_list.
                            super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                            _M_node.super__List_node_base._M_next,0x18);
            local_b0.m_lru_list.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl._M_node.super__List_node_base._M_next = p_Var1;
          }
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_b0.m_keyed_elements._M_h);
          std::
          vector<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
          ::~vector(&local_b0.m_elements);
          return 0;
        }
      }
      std::__throw_bad_optional_access();
    }
  }
  std::__throw_bad_optional_access();
}

Assistant:

int main()
{
    // Create a cache with 2 items.
    cappuccino::lru_cache<uint64_t, std::string> cache{2};

    // Insert hello and world.
    cache.insert(1, "Hello");
    cache.insert(2, "World");

    {
        // Grab them
        auto hello = cache.find(1);
        auto world = cache.find(2);

        // Lets use them!
        std::cout << hello.value() << ", " << world.value() << "!" << std::endl;
    }

    // Insert hola, this will replace "Hello" since its the oldest lru item.
    cache.insert(3, "Hola");

    {
        auto hola  = cache.find(3);
        auto hello = cache.find(1); // this will return an empty optional now
        auto world = cache.find(2); // this value should still be available!

        // Grab and print again!
        std::cout << hola.value() << ", " << world.value() << "!" << std::endl;

        // No value should be present in the cache for the hello key.
        if (hello.has_value())
        {
            std::cout << "impossibru!" << std::endl;
        }
    }

    return 0;
}